

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

void mocker::ir::printModule(Module *module,ostream *out)

{
  size_t sVar1;
  uint __len;
  char cVar2;
  long *plVar3;
  ostream *poVar4;
  long *plVar5;
  long lVar6;
  uint __val;
  Module *pMVar7;
  _Hash_node_base *p_Var8;
  uint uVar9;
  string str;
  string __str;
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  Module *local_a0;
  Module *local_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  ostream *local_50;
  size_type local_48;
  long local_40;
  long local_38;
  
  pMVar7 = (Module *)
           (module->globalVars).
           super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  local_a0 = module;
  if (pMVar7 != module) {
    local_50 = out;
    do {
      local_e0 = local_d0;
      sVar1 = (pMVar7->globalVars).
              super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>.
              _M_impl._M_node._M_size;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,sVar1,(long)(pMVar7->funcs)._M_h._M_buckets + sVar1);
      std::__cxx11::string::append((char *)&local_e0);
      local_40 = *(long *)&(pMVar7->funcs)._M_h._M_rehash_policy;
      local_98 = pMVar7;
      if (local_40 != 0) {
        local_48 = (pMVar7->funcs)._M_h._M_element_count;
        lVar6 = 0;
        do {
          uVar9 = (uint)*(char *)(local_48 + lVar6);
          __val = -uVar9;
          if (0 < (int)uVar9) {
            __val = uVar9;
          }
          __len = 3 - (__val < 100);
          if (__val < 10) {
            __len = 1;
          }
          local_90[0] = local_80;
          local_38 = lVar6;
          std::__cxx11::string::_M_construct
                    ((ulong)local_90,(char)__len - (*(char *)(local_48 + lVar6) >> 7));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar9 >> 0x1f) + (long)local_90[0]),__len,__val);
          plVar3 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x1aeb23);
          plVar5 = plVar3 + 2;
          if ((long *)*plVar3 == plVar5) {
            local_60 = *plVar5;
            lStack_58 = plVar3[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar5;
            local_70 = (long *)*plVar3;
          }
          local_68 = plVar3[1];
          *plVar3 = (long)plVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
          plVar5 = plVar3 + 2;
          if ((long *)*plVar3 == plVar5) {
            local_b0 = *plVar5;
            lStack_a8 = plVar3[3];
            local_c0 = &local_b0;
          }
          else {
            local_b0 = *plVar5;
            local_c0 = (long *)*plVar3;
          }
          local_b8 = plVar3[1];
          *plVar3 = (long)plVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_c0);
          if (local_c0 != &local_b0) {
            operator_delete(local_c0,local_b0 + 1);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70,local_60 + 1);
          }
          if (local_90[0] != local_80) {
            operator_delete(local_90[0],local_80[0] + 1);
          }
          lVar6 = local_38 + 1;
        } while (local_40 != lVar6);
      }
      if (*(char *)((long)local_e0 + local_d8 + -1) == ',') {
        std::__cxx11::string::pop_back();
      }
      out = local_50;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_50,(char *)local_e0,local_d8);
      pMVar7 = local_98;
      local_c0 = (long *)CONCAT71(local_c0._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_c0,1);
      if (local_e0 != local_d0) {
        operator_delete(local_e0,local_d0[0] + 1);
      }
      pMVar7 = (Module *)
               (pMVar7->globalVars).
               super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>.
               _M_impl._M_node.super__List_node_base._M_next;
    } while (pMVar7 != local_a0);
  }
  cVar2 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  for (p_Var8 = (local_a0->funcs)._M_h._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
      p_Var8 = p_Var8->_M_nxt) {
    printFunc((FunctionModule *)(p_Var8 + 5),out);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  return;
}

Assistant:

void printModule(const Module &module, std::ostream &out) {
  for (auto &var : module.getGlobalVars()) {
    std::string str = var.getLabel() + ":";
    for (auto &ch : var.getData())
      str += " " + std::to_string(ch) + ",";
    if (str.back() == ',')
      str.pop_back();
    out << str << '\n';
  }
  out << std::endl;

  for (auto &kv : module.getFuncs()) {
    printFunc(kv.second, out);
    out << std::endl;
  }
}